

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O2

double __thiscall
Alg::opim_approx_fast
          (Alg *this,Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list
          ,double epsilon,double feps,double delta,string *model,string *graphname,int mode)

{
  THyperGraph *this_00;
  Nodelist *vecSeed;
  double dVar1;
  double dVar2;
  ostream *poVar3;
  char *__rhs;
  undefined8 uVar4;
  Graph *graph_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  uint uVar6;
  int i;
  long lVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  pointer pcVar17;
  double __x;
  double dVar18;
  double local_528;
  double local_508;
  double approxOPIMC;
  double infVldt;
  double local_448;
  double local_440;
  double local_438;
  double timeb_f;
  double timeb_b;
  double timeb_n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string *local_3f8;
  string *local_3f0;
  HyperGraph *local_3e8;
  double local_3e0;
  vector<double,_std::allocator<double>_> time_f;
  vector<double,_std::allocator<double>_> time_b;
  vector<double,_std::allocator<double>_> time_n;
  vector<double,_std::allocator<double>_> approx_f;
  vector<double,_std::allocator<double>_> approx_b;
  vector<double,_std::allocator<double>_> approx_n;
  vector<double,_std::allocator<double>_> inf_f;
  vector<double,_std::allocator<double>_> inf_b;
  vector<double,_std::allocator<double>_> inf_n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  time_t now;
  ofstream outfile;
  Timer local_50;
  
  local_3f8 = graphname;
  local_3f0 = model;
  local_50.__StartTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_50.__processName = "OPIM-APPORX";
  local_50.__LastTime.__d.__r = local_50.__StartTime.__d.__r;
  local_50.__EndTime.__d.__r = local_50.__StartTime.__d.__r;
  std::ofstream::ofstream(&outfile);
  dVar9 = log(36.0 / delta);
  dVar10 = log(36.0 / delta);
  timeb_n = 0.0;
  timeb_b = 0.0;
  timeb_f = 0.0;
  inf_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inf_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  inf_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  inf_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  inf_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  inf_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inf_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  inf_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  inf_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  approx_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  approx_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  approx_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  approx_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  approx_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  approx_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  approx_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  approx_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  approx_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  time_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  time_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  time_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  time_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  time_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  time_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  time_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  time_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  time_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_3e8 = &this->__hyperG;
  this_00 = &this->__hyperGVldt;
  dVar1 = (dVar9 + dVar9) / 9.0;
  vecSeed = &this->__vecSeed;
  __x = dVar9 * 0.5;
  dVar9 = dVar9 / 18.0;
  dVar10 = dVar10 * 0.5;
  dVar2 = SQRT(__x);
  dVar11 = SQRT(dVar10);
  local_448 = 0.0;
  local_440 = 0.0;
  local_508 = 0.0;
  local_438 = 0.0;
  lVar7 = 0;
  do {
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar6 = 1000 << ((byte)lVar7 & 0x1f);
    Timer::get_operation_time(&local_50);
    HyperGraph::build_n_RRsets(local_3e8,(long)(int)uVar6);
    HyperGraph::build_n_RRsets(this_00,(long)(int)uVar6);
    poVar3 = std::operator<<((ostream *)&std::cout,"# RR sets: ");
    graph_00 = (Graph *)(ulong)uVar6;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar6);
    std::endl<char,std::char_traits<char>>(poVar3);
    this->__numRRsets = (this->__hyperG).__numRRsets;
    dVar12 = Timer::get_operation_time(&local_50);
    dVar13 = max_cover_lazy_budget_fast_end(this,graph_00,budget,budget_list,0.01,&timeb_n,mode);
    local_3e0 = Timer::get_operation_time(&local_50);
    infVldt = HyperGraph::self_inf_cal(this_00,vecSeed);
    if (mode == 1) {
      local_528 = this->__boundLast_inf;
      if (this->__boundLast_inf <= this->__boundLast_inf_cost) {
        local_528 = this->__boundLast_inf_cost;
      }
    }
    else {
      local_528 = dVar13;
      if (mode == 2) {
        if (this->__is_inf_cost == true) {
          local_528 = this->__boundMin_inf_cost;
        }
        else {
          local_528 = this->__boundMin_inf;
        }
      }
    }
    dVar18 = ((double)CONCAT44(0x45300000,(int)(this->__numRRsets >> 0x20)) - 1.9342813113834067e+25
             ) + ((double)CONCAT44(0x43300000,(int)this->__numRRsets) - 4503599627370496.0);
    uVar6 = this->__numV;
    dVar14 = (infVldt * dVar18) / (double)uVar6 + dVar1;
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    dVar15 = dVar2;
    if (__x < 0.0) {
      dVar15 = sqrt(__x);
    }
    dVar18 = (dVar18 * local_528) / (double)uVar6 + dVar10;
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
    }
    else {
      dVar18 = SQRT(dVar18);
    }
    dVar16 = dVar11;
    if (dVar10 < 0.0) {
      dVar16 = sqrt(dVar10);
    }
    dVar14 = (dVar14 - dVar15) * (dVar14 - dVar15) - dVar9;
    dVar15 = 0.0;
    if (0.0 <= dVar14) {
      dVar15 = dVar14;
    }
    approxOPIMC = dVar15 / ((dVar18 + dVar16) * (dVar18 + dVar16));
    poVar3 = std::operator<<((ostream *)&std::cout," -->OPIM-APPROX-F-0.01 (");
    lVar7 = lVar7 + 1;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"/");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc);
    std::operator<<(poVar3,") approx. (max-cover): ");
    poVar3 = std::ostream::_M_insert<double>(approxOPIMC);
    std::operator<<(poVar3," (");
    poVar3 = std::ostream::_M_insert<double>(dVar13 / local_528);
    poVar3 = std::operator<<(poVar3,"), #RR sets: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,'\n');
    std::operator<<((ostream *)&std::cout,"==>Influence via R2: ");
    poVar3 = std::ostream::_M_insert<double>(infVldt);
    std::operator<<(poVar3,", time: ");
    poVar3 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
    std::operator<<(poVar3,'\n');
    std::operator<<((ostream *)&std::cout,"==>Time for RR sets and greedy: ");
    local_508 = local_508 + dVar12;
    poVar3 = std::ostream::_M_insert<double>(local_508);
    std::operator<<(poVar3,", ");
    local_438 = local_438 + local_3e0;
    pcVar17 = (pointer)(local_508 + local_438);
    poVar3 = std::ostream::_M_insert<double>((double)pcVar17);
    std::operator<<(poVar3,'\n');
    std::operator<<((ostream *)&std::cout,"==>Time for Bound Computation: ");
    poVar3 = std::ostream::_M_insert<double>(timeb_n);
    std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<((ostream *)&std::cout,"Seed size: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::vector<double,_std::allocator<double>_>::push_back(&approx_n,&approxOPIMC);
    std::vector<double,_std::allocator<double>_>::push_back(&inf_n,&infVldt);
    pbVar5 = &local_418;
    local_418._M_dataplus._M_p = pcVar17;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&time_n,(double *)pbVar5);
    Timer::get_operation_time(&local_50);
    dVar12 = max_cover_lazy_budget_fast_end
                       (this,(Graph *)pbVar5,budget,budget_list,0.05,&timeb_b,mode);
    dVar13 = Timer::get_operation_time(&local_50);
    infVldt = HyperGraph::self_inf_cal(this_00,vecSeed);
    if (mode == 1) {
      local_528 = this->__boundLast_inf;
      if (this->__boundLast_inf <= this->__boundLast_inf_cost) {
        local_528 = this->__boundLast_inf_cost;
      }
    }
    else {
      local_528 = dVar12;
      if (mode == 2) {
        if (this->__is_inf_cost == true) {
          local_528 = this->__boundMin_inf_cost;
        }
        else {
          local_528 = this->__boundMin_inf;
        }
      }
    }
    dVar18 = ((double)CONCAT44(0x45300000,(int)(this->__numRRsets >> 0x20)) - 1.9342813113834067e+25
             ) + ((double)CONCAT44(0x43300000,(int)this->__numRRsets) - 4503599627370496.0);
    uVar6 = this->__numV;
    dVar14 = (infVldt * dVar18) / (double)uVar6 + dVar1;
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    dVar15 = dVar2;
    if (__x < 0.0) {
      dVar15 = sqrt(__x);
    }
    dVar18 = (dVar18 * local_528) / (double)uVar6 + dVar10;
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
    }
    else {
      dVar18 = SQRT(dVar18);
    }
    dVar16 = dVar11;
    if (dVar10 < 0.0) {
      dVar16 = sqrt(dVar10);
    }
    dVar14 = (dVar14 - dVar15) * (dVar14 - dVar15) - dVar9;
    dVar15 = 0.0;
    if (0.0 <= dVar14) {
      dVar15 = dVar14;
    }
    approxOPIMC = dVar15 / ((dVar18 + dVar16) * (dVar18 + dVar16));
    poVar3 = std::operator<<((ostream *)&std::cout," -->OPIM-APPROX-F-0.05 (");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"/");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc);
    std::operator<<(poVar3,") approx. (max-cover): ");
    poVar3 = std::ostream::_M_insert<double>(approxOPIMC);
    std::operator<<(poVar3," (");
    poVar3 = std::ostream::_M_insert<double>(dVar12 / local_528);
    poVar3 = std::operator<<(poVar3,"), #RR sets: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,'\n');
    std::operator<<((ostream *)&std::cout,"==>Influence via R2: ");
    poVar3 = std::ostream::_M_insert<double>(infVldt);
    std::operator<<(poVar3,", time: ");
    poVar3 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
    std::operator<<(poVar3,'\n');
    std::operator<<((ostream *)&std::cout,"==>Time for RR sets and greedy: ");
    poVar3 = std::ostream::_M_insert<double>(local_508);
    std::operator<<(poVar3,", ");
    local_440 = local_440 + dVar13;
    pcVar17 = (pointer)(local_508 + local_440);
    poVar3 = std::ostream::_M_insert<double>((double)pcVar17);
    std::operator<<(poVar3,'\n');
    std::operator<<((ostream *)&std::cout,"==>Time for Bound Computation: ");
    poVar3 = std::ostream::_M_insert<double>(timeb_b);
    std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<((ostream *)&std::cout,"Seed size: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::vector<double,_std::allocator<double>_>::push_back(&approx_b,&approxOPIMC);
    std::vector<double,_std::allocator<double>_>::push_back(&inf_b,&infVldt);
    pbVar5 = &local_418;
    local_418._M_dataplus._M_p = pcVar17;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&time_b,(double *)pbVar5);
    Timer::get_operation_time(&local_50);
    dVar12 = max_cover_lazy_budget_fast_end
                       (this,(Graph *)pbVar5,budget,budget_list,0.1,&timeb_f,mode);
    dVar13 = Timer::get_operation_time(&local_50);
    infVldt = HyperGraph::self_inf_cal(this_00,vecSeed);
    if (mode == 1) {
      local_528 = this->__boundLast_inf;
      if (this->__boundLast_inf <= this->__boundLast_inf_cost) {
        local_528 = this->__boundLast_inf_cost;
      }
    }
    else {
      local_528 = dVar12;
      if (mode == 2) {
        if (this->__is_inf_cost == true) {
          local_528 = this->__boundMin_inf_cost;
        }
        else {
          local_528 = this->__boundMin_inf;
        }
      }
    }
    dVar18 = ((double)CONCAT44(0x45300000,(int)(this->__numRRsets >> 0x20)) - 1.9342813113834067e+25
             ) + ((double)CONCAT44(0x43300000,(int)this->__numRRsets) - 4503599627370496.0);
    uVar6 = this->__numV;
    dVar14 = (infVldt * dVar18) / (double)uVar6 + dVar1;
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    dVar15 = dVar2;
    if (__x < 0.0) {
      dVar15 = sqrt(__x);
    }
    dVar18 = (dVar18 * local_528) / (double)uVar6 + dVar10;
    if (dVar18 < 0.0) {
      dVar18 = sqrt(dVar18);
    }
    else {
      dVar18 = SQRT(dVar18);
    }
    dVar16 = dVar11;
    if (dVar10 < 0.0) {
      dVar16 = sqrt(dVar10);
    }
    dVar14 = (dVar14 - dVar15) * (dVar14 - dVar15) - dVar9;
    dVar15 = 0.0;
    if (0.0 <= dVar14) {
      dVar15 = dVar14;
    }
    approxOPIMC = dVar15 / ((dVar18 + dVar16) * (dVar18 + dVar16));
    poVar3 = std::operator<<((ostream *)&std::cout," -->OPIM-APPROX-F-0.1 (");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"/");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xc);
    std::operator<<(poVar3,") approx. (max-cover): ");
    poVar3 = std::ostream::_M_insert<double>(approxOPIMC);
    std::operator<<(poVar3," (");
    poVar3 = std::ostream::_M_insert<double>(dVar12 / local_528);
    poVar3 = std::operator<<(poVar3,"), #RR sets: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,'\n');
    std::operator<<((ostream *)&std::cout,"==>Influence via R2: ");
    poVar3 = std::ostream::_M_insert<double>(infVldt);
    std::operator<<(poVar3,", time: ");
    poVar3 = std::ostream::_M_insert<double>(this->__tRes->__RunningTime);
    std::operator<<(poVar3,'\n');
    std::operator<<((ostream *)&std::cout,"==>Time for RR sets and greedy: ");
    poVar3 = std::ostream::_M_insert<double>(local_508);
    std::operator<<(poVar3,", ");
    local_448 = local_448 + dVar13;
    pcVar17 = (pointer)(local_508 + local_448);
    poVar3 = std::ostream::_M_insert<double>((double)pcVar17);
    std::operator<<(poVar3,'\n');
    std::operator<<((ostream *)&std::cout,"==>Time for Bound Computation: ");
    poVar3 = std::ostream::_M_insert<double>(timeb_f);
    std::operator<<(poVar3,'\n');
    poVar3 = std::operator<<((ostream *)&std::cout,"Seed size: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::vector<double,_std::allocator<double>_>::push_back(&approx_f,&approxOPIMC);
    std::vector<double,_std::allocator<double>_>::push_back(&inf_f,&infVldt);
    local_418._M_dataplus._M_p = pcVar17;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&time_f,(double *)&local_418)
    ;
  } while (lVar7 != 0xc);
  now = time((time_t *)0x0);
  __rhs = ctime(&now);
  std::operator+(&local_2b8,"xi/",local_3f0);
  std::operator+(&local_298,&local_2b8,"_");
  std::operator+(&local_278,&local_298,local_3f8);
  std::operator+(&local_418,&local_278,"_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&approxOPIMC,
                 &local_418,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&infVldt,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&approxOPIMC,
                 ".txt");
  std::ofstream::open((string *)&outfile,(_Ios_Openmode)&infVldt);
  std::__cxx11::string::~string((string *)&infVldt);
  std::__cxx11::string::~string((string *)&approxOPIMC);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)approx_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)approx_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    poVar3 = std::ostream::_M_insert<double>
                       (approx_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8]);
    std::operator<<(poVar3,",");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&outfile);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)time_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)time_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    poVar3 = std::ostream::_M_insert<double>
                       (time_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8]);
    std::operator<<(poVar3,",");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&outfile);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)inf_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)inf_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    poVar3 = std::ostream::_M_insert<double>
                       (inf_n.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8]);
    std::operator<<(poVar3,",");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&outfile);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)approx_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)approx_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    poVar3 = std::ostream::_M_insert<double>
                       (approx_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8]);
    std::operator<<(poVar3,",");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&outfile);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)time_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)time_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    poVar3 = std::ostream::_M_insert<double>
                       (time_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8]);
    std::operator<<(poVar3,",");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&outfile);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)inf_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)inf_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    poVar3 = std::ostream::_M_insert<double>
                       (inf_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8]);
    std::operator<<(poVar3,",");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&outfile);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)approx_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)approx_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    poVar3 = std::ostream::_M_insert<double>
                       (approx_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8]);
    std::operator<<(poVar3,",");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&outfile);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)time_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)time_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    poVar3 = std::ostream::_M_insert<double>
                       (time_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8]);
    std::operator<<(poVar3,",");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&outfile);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)inf_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)inf_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    poVar3 = std::ostream::_M_insert<double>
                       (inf_f.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8]);
    std::operator<<(poVar3,",");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&outfile);
  uVar4 = std::ofstream::close();
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&time_f.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&time_b.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&time_n.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&approx_f.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&approx_b.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&approx_n.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&inf_f.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&inf_b.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&inf_n.super__Vector_base<double,_std::allocator<double>_>);
  std::ofstream::~ofstream(&outfile);
  _Unwind_Resume(uVar4);
}

Assistant:

double Alg::opim_approx_fast(const Graph & graph, const double budget, const std::vector<double> & budget_list,
        const double epsilon, const double feps, const double delta, const std::string model,
        const std::string graphname, const int mode) {
    Timer timerOPIMC("OPIM-APPORX");
    std::ofstream outfile;
    const auto numIter = 12;
    const auto theta_0 = 1000;
    const double a1 = log(numIter * 3.0 / delta);
    const double a2 = log(numIter * 3.0 / delta);
    double time1_n = 0.0, time2_n = 0.0;
    double timeb_n = 0.0;
    double time1_b = 0.0, time2_b = 0.0;
    double timeb_b = 0.0;
    double time1_f = 0.0, time2_f = 0.0;
    double timeb_f = 0.0;
    double time1_fs = 0.0, time2_fs = 0.0;
    double timeb_fs = 0.0;
    double time1_ft = 0.0, time2_ft = 0.0;
    double timeb_ft = 0.0;
    double time_rr = 0.0;
    std::vector<double> inf_n, inf_b, inf_f;
    std::vector<double> approx_n, approx_b, approx_f;
    std::vector<double> time_n, time_b, time_f;
    size_t idx = 0;
    while (true) {
        std::cout << idx << std::endl;
        const auto numR = theta_0 << idx;
        timerOPIMC.get_operation_time();
        __hyperG.build_n_RRsets(numR); // R1
        __hyperGVldt.build_n_RRsets(numR); // R2
        std::cout << "# RR sets: " << numR << std::endl;
        __numRRsets = __hyperG.get_RR_sets_size();
        /// OPIM-B-F 0.01
        time_rr += timerOPIMC.get_operation_time();
        auto infSelf = max_cover_budget_fast_end(graph, budget, budget_list, 0.01, timeb_n, mode);
        time2_n += timerOPIMC.get_operation_time();
        auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        auto degVldt = infVldt * __numRRsets / __numV;
        auto upperBound = infSelf;
        if (mode == 1) {
            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        auto upperDegOPT = upperBound * __numRRsets / __numV;
        auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        auto approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-APPROX-F-0.01 (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " <<
                  approxOPIMC << " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
        std::cout << "==>Time for RR sets and greedy: " << time_rr << ", " << time2_n + time_rr << '\n';
        std::cout << "==>Time for Bound Computation: " << timeb_n << '\n';
        std::cout << "Seed size: " << __vecSeed.size() << std::endl;
        approx_n.push_back(approxOPIMC);
        inf_n.push_back(infVldt);
        time_n.push_back(time2_n + time_rr);

        /// OPIM-B-F 0.05
        time1_b += timerOPIMC.get_operation_time();
        infSelf = max_cover_budget_fast_end(graph, budget, budget_list, 0.05, timeb_b, mode);
        time2_b += timerOPIMC.get_operation_time();
        infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        degVldt = infVldt * __numRRsets / __numV;
        upperBound = infSelf;
        if (mode == 1) {
            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        upperDegOPT = upperBound * __numRRsets / __numV;
        lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-APPROX-F-0.05 (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " <<
                  approxOPIMC << " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
        std::cout << "==>Time for RR sets and greedy: " << time_rr << ", " << time2_b + time_rr << '\n';
        std::cout << "==>Time for Bound Computation: " << timeb_b << '\n';
        std::cout << "Seed size: " << __vecSeed.size() << std::endl;
        approx_b.push_back(approxOPIMC);
        inf_b.push_back(infVldt);
        time_b.push_back(time2_b + time_rr);

        /// OPIM-B-F 0.1
        time1_f += timerOPIMC.get_operation_time();
        infSelf = max_cover_budget_fast_end(graph, budget, budget_list, 0.1, timeb_f, mode);
        time2_f += timerOPIMC.get_operation_time();
        infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        degVldt = infVldt * __numRRsets / __numV;
        upperBound = infSelf;
        if (mode == 1) {
            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        upperDegOPT = upperBound * __numRRsets / __numV;
        lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-APPROX-F-0.1 (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " <<
                  approxOPIMC << " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
        std::cout << "==>Time for RR sets and greedy: " << time_rr << ", " << time2_f + time_rr << '\n';
        std::cout << "==>Time for Bound Computation: " << timeb_f << '\n';
        std::cout << "Seed size: " << __vecSeed.size() << std::endl;
        approx_f.push_back(approxOPIMC);
        inf_f.push_back(infVldt);
        time_f.push_back(time2_f + time_rr);
        idx = idx + 1;
        if (idx == numIter) {
            break;
        }
    }
    time_t now = time(0);
    char* dt = ctime(&now);
    outfile.open("xi/" + model + "_" + graphname + "_" + dt + ".txt");
    for(int i = 0; i < approx_n.size(); i++) {
        outfile << approx_n[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < time_n.size(); i++) {
        outfile << time_n[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < inf_n.size(); i++) {
        outfile << inf_n[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < approx_b.size(); i++) {
        outfile << approx_b[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < time_b.size(); i++) {
        outfile << time_b[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < inf_b.size(); i++) {
        outfile << inf_b[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < approx_f.size(); i++) {
        outfile << approx_f[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < time_f.size(); i++) {
        outfile << time_f[i] << ",";
    }
    outfile << std::endl;
    for(int i = 0; i < inf_f.size(); i++) {
        outfile << inf_f[i] << ",";
    }
    outfile << std::endl;
    outfile.close();
}